

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

cmSourceGroup * __thiscall
cmMakefile::GetSourceGroup
          (cmMakefile *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *name)

{
  cmSourceGroup *pcVar1;
  pointer pbVar2;
  __type _Var3;
  string *__lhs;
  cmSourceGroup *this_00;
  ulong uVar4;
  cmSourceGroup *srcGroup;
  
  this_00 = (this->SourceGroups).super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pcVar1 = (this->SourceGroups).super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (this_00 == pcVar1) {
      return (cmSourceGroup *)0x0;
    }
    __lhs = cmSourceGroup::GetName_abi_cxx11_(this_00);
    _Var3 = std::operator==(__lhs,(name->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start);
    if (_Var3) break;
    this_00 = this_00 + 1;
  }
  uVar4 = 1;
  do {
    pbVar2 = (name->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(name->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5) <= uVar4) {
      return this_00;
    }
    this_00 = cmSourceGroup::LookupChild(this_00,pbVar2 + uVar4);
    uVar4 = (ulong)((int)uVar4 + 1);
  } while (this_00 != (cmSourceGroup *)0x0);
  return (cmSourceGroup *)0x0;
}

Assistant:

cmSourceGroup* cmMakefile::GetSourceGroup(
  const std::vector<std::string>& name) const
{
  cmSourceGroup* sg = nullptr;

  // first look for source group starting with the same as the one we want
  for (cmSourceGroup const& srcGroup : this->SourceGroups) {
    std::string const& sgName = srcGroup.GetName();
    if (sgName == name[0]) {
      sg = const_cast<cmSourceGroup*>(&srcGroup);
      break;
    }
  }

  if (sg != nullptr) {
    // iterate through its children to find match source group
    for (unsigned int i = 1; i < name.size(); ++i) {
      sg = sg->LookupChild(name[i]);
      if (sg == nullptr) {
        break;
      }
    }
  }
  return sg;
}